

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O2

int ev_handler(mg_connection *conn,mg_event ev)

{
  int iVar1;
  
  if (ev == MG_AUTH) {
    return 2;
  }
  if (ev == MG_REQUEST) {
    fprintf(_stdout,"Processing %s\n",conn->uri);
    iVar1 = exec_route(conn->uri,conn);
    return (int)(iVar1 != 0 && iVar1 != 0x194);
  }
  return 0;
}

Assistant:

static int ev_handler(struct mg_connection *conn, enum mg_event ev) {
	int exec_result;

    switch (ev) {
        case MG_AUTH:
            return MG_MORE;
        case MG_REQUEST:
			fprintf(stdout, "Processing %s\n", conn->uri);
            
			exec_result = exec_route(conn->uri, conn);

			if (exec_result == 404) {
				return MG_FALSE;
			}
			else if (!exec_result) {
				return MG_FALSE;
			}

            return MG_TRUE;
        default:
            return MG_FALSE;
    }
}